

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O0

void project_object_elemental
               (project_object_handler_context_t *context,wchar_t element,char *singular_verb,
               char *plural_verb)

{
  char *local_30;
  char *plural_verb_local;
  char *singular_verb_local;
  wchar_t element_local;
  project_object_handler_context_t *context_local;
  
  if ((context->obj->el_info[element].flags & 1) != 0) {
    context->do_kill = true;
    local_30 = plural_verb;
    if (context->obj->number == '\x01') {
      local_30 = singular_verb;
    }
    context->note_kill = local_30;
    context->ignore = (context->obj->el_info[element].flags & 2) != 0;
  }
  return;
}

Assistant:

static void project_object_elemental(project_object_handler_context_t *context,
									 int element, const char *singular_verb,
									 const char *plural_verb)
{
	if (context->obj->el_info[element].flags & EL_INFO_HATES) {
		context->do_kill = true;
		context->note_kill = VERB_AGREEMENT(context->obj->number,
											singular_verb, plural_verb);
		context->ignore = (context->obj->el_info[element].flags &
						   EL_INFO_IGNORE) ? true : false;
	}
}